

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cpp
# Opt level: O2

int wasm::Bits::countTrailingZeroes(uint64_t v)

{
  long lVar1;
  int iVar2;
  
  if (v == 0) {
    iVar2 = 0x40;
  }
  else {
    lVar1 = 0;
    if (v != 0) {
      for (; (v >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    iVar2 = (int)lVar1;
  }
  return iVar2;
}

Assistant:

int countTrailingZeroes(uint64_t v) {
  if (v == 0) {
    return 64;
  }
#if __has_builtin(__builtin_ctzll) || defined(__GNUC__)
  return __builtin_ctzll(v);
#elif defined(_MSC_VER) && defined(_M_X64)
  unsigned long count;
  _BitScanForward64(&count, v);
  return (int)count;
#else
  return (uint32_t)v ? countTrailingZeroes((uint32_t)v)
                     : 32 + countTrailingZeroes((uint32_t)(v >> 32));
#endif
}